

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_unshuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  size_t __size;
  int extraout_EAX;
  void *__src;
  long lVar1;
  
  __size = length * 4;
  __src = malloc(__size);
  if (0 < length) {
    lVar1 = 0;
    do {
      *(char *)((long)__src + lVar1 * 4 + (__size - 1)) = heap[lVar1 + (__size - 1)];
      *(char *)((long)__src + lVar1 * 4 + (__size - 2)) = heap[lVar1 + length * 3 + -1];
      *(char *)((long)__src + lVar1 * 4 + (__size - 3)) = heap[lVar1 + length * 2 + -1];
      *(char *)((long)__src + lVar1 * 4 + (__size - 4)) = heap[lVar1 + length + -1];
      lVar1 = lVar1 + -1;
    } while (-lVar1 != length);
  }
  memcpy(heap,__src,__size);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_4bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 4-byte integers or floats */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    heapptr = heap + (4 * length) -1;
    cptr = ptr + (4 * length) -1;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       heapptr--;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);
    return(*status);
}